

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::JsonUnitTestResultPrinter::PrintJsonUnitTest
               (ostream *stream,UnitTest *unit_test)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  TestSuite *pTVar4;
  size_t width;
  TimeInMillis ms;
  TimeInMillis ms_00;
  int i;
  bool bVar5;
  allocator local_b2;
  allocator local_b1;
  string local_b0;
  string local_90;
  string kIndent;
  string kTestsuites;
  
  std::__cxx11::string::string((string *)&kTestsuites,"testsuites",(allocator *)&kIndent);
  Indent_abi_cxx11_(&kIndent,(internal *)0x2,width);
  std::operator<<(stream,"{\n");
  std::__cxx11::string::string((string *)&local_b0,"tests",(allocator *)&local_90);
  iVar1 = UnitTest::reportable_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar1,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_b0,"failures",(allocator *)&local_90);
  iVar1 = UnitTest::failed_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar1,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_b0,"disabled",(allocator *)&local_90);
  iVar1 = UnitTest::reportable_disabled_test_count(unit_test);
  OutputJsonKey(stream,&kTestsuites,&local_b0,iVar1,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_b0,"errors",(allocator *)&local_90);
  iVar1 = 0;
  OutputJsonKey(stream,&kTestsuites,&local_b0,0,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  if (FLAGS_gtest_shuffle == '\x01') {
    std::__cxx11::string::string((string *)&local_b0,"random_seed",(allocator *)&local_90);
    OutputJsonKey(stream,&kTestsuites,&local_b0,unit_test->impl_->random_seed_,&kIndent,true);
    std::__cxx11::string::_M_dispose();
  }
  std::__cxx11::string::string((string *)&local_b0,"timestamp",&local_b2);
  FormatEpochTimeInMillisAsRFC3339_abi_cxx11_
            (&local_90,(internal *)unit_test->impl_->start_timestamp_,ms);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_90,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_b0,"time",&local_b2);
  FormatTimeInMillisAsDuration_abi_cxx11_
            (&local_90,(internal *)unit_test->impl_->elapsed_time_,ms_00);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_90,&kIndent,false);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  TestPropertiesAsJson(&local_b0,&unit_test->impl_->ad_hoc_test_result_,&kIndent);
  poVar3 = std::operator<<(stream,(string *)&local_b0);
  std::operator<<(poVar3,",\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_b0,"name",&local_b2);
  std::__cxx11::string::string((string *)&local_90,"AllTests",&local_b1);
  OutputJsonKey(stream,&kTestsuites,&local_b0,&local_90,&kIndent,true);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  poVar3 = std::operator<<(stream,(string *)&kIndent);
  poVar3 = std::operator<<(poVar3,"\"");
  poVar3 = std::operator<<(poVar3,(string *)&kTestsuites);
  std::operator<<(poVar3,"\": [\n");
  bVar5 = false;
  for (; iVar1 < (int)((ulong)((long)(unit_test->impl_->test_suites_).
                                     super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(unit_test->impl_->test_suites_).
                                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start) >> 3);
      iVar1 = iVar1 + 1) {
    pTVar4 = UnitTest::GetTestSuite(unit_test,iVar1);
    iVar2 = TestSuite::reportable_test_count(pTVar4);
    if (0 < iVar2) {
      if (bVar5) {
        std::operator<<(stream,",\n");
      }
      pTVar4 = UnitTest::GetTestSuite(unit_test,iVar1);
      PrintJsonTestSuite(stream,pTVar4);
      bVar5 = true;
    }
  }
  poVar3 = std::operator<<(stream,"\n");
  poVar3 = std::operator<<(poVar3,(string *)&kIndent);
  poVar3 = std::operator<<(poVar3,"]\n");
  std::operator<<(poVar3,"}\n");
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  return;
}

Assistant:

void JsonUnitTestResultPrinter::PrintJsonUnitTest(std::ostream* stream,
                                                  const UnitTest& unit_test) {
  const std::string kTestsuites = "testsuites";
  const std::string kIndent = Indent(2);
  *stream << "{\n";

  OutputJsonKey(stream, kTestsuites, "tests", unit_test.reportable_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "failures", unit_test.failed_test_count(),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "disabled",
                unit_test.reportable_disabled_test_count(), kIndent);
  OutputJsonKey(stream, kTestsuites, "errors", 0, kIndent);
  if (GTEST_FLAG(shuffle)) {
    OutputJsonKey(stream, kTestsuites, "random_seed", unit_test.random_seed(),
                  kIndent);
  }
  OutputJsonKey(stream, kTestsuites, "timestamp",
                FormatEpochTimeInMillisAsRFC3339(unit_test.start_timestamp()),
                kIndent);
  OutputJsonKey(stream, kTestsuites, "time",
                FormatTimeInMillisAsDuration(unit_test.elapsed_time()), kIndent,
                false);

  *stream << TestPropertiesAsJson(unit_test.ad_hoc_test_result(), kIndent)
          << ",\n";

  OutputJsonKey(stream, kTestsuites, "name", "AllTests", kIndent);
  *stream << kIndent << "\"" << kTestsuites << "\": [\n";

  bool comma = false;
  for (int i = 0; i < unit_test.total_test_suite_count(); ++i) {
    if (unit_test.GetTestSuite(i)->reportable_test_count() > 0) {
      if (comma) {
        *stream << ",\n";
      } else {
        comma = true;
      }
      PrintJsonTestSuite(stream, *unit_test.GetTestSuite(i));
    }
  }

  *stream << "\n" << kIndent << "]\n" << "}\n";
}